

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

int __thiscall jbcoin::STObject::getFieldIndex(STObject *this,SField *field)

{
  int iVar1;
  int iVar2;
  STVar *elem;
  pointer pSVar3;
  
  if (this->mType == (SOTemplate *)0x0) {
    pSVar3 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar1 = 0;
    while ((iVar2 = -1,
           pSVar3 != (this->v_).
                     super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish &&
           (iVar2 = iVar1, pSVar3->p_->fName->fieldCode != field->fieldCode))) {
      iVar1 = iVar1 + 1;
      pSVar3 = pSVar3 + 1;
    }
    return iVar2;
  }
  iVar1 = SOTemplate::getIndex(this->mType,field);
  return iVar1;
}

Assistant:

int STObject::getFieldIndex (SField const& field) const
{
    if (mType != nullptr)
        return mType->getIndex (field);

    int i = 0;
    for (auto const& elem : v_)
    {
        if (elem->getFName () == field)
            return i;
        ++i;
    }
    return -1;
}